

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O1

CURLcode Curl_headers_push(Curl_easy *data,char *header,uchar type)

{
  Curl_llist *list;
  char cVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  Curl_header_store *pCVar7;
  long lVar8;
  CURLcode CVar9;
  char *pcVar10;
  char *local_40;
  
  cVar1 = *header;
  if (cVar1 == '\n') {
    return CURLE_OK;
  }
  if (cVar1 == '\r') {
    return CURLE_OK;
  }
  pcVar3 = strchr(header,0xd);
  if ((pcVar3 == (char *)0x0) && (pcVar3 = strchr(header,10), pcVar3 == (char *)0x0)) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  pcVar10 = pcVar3 + (1 - (long)header);
  if ((cVar1 == ' ') || (cVar1 == '\t')) {
    pCVar7 = (data->state).prevhead;
    if (pCVar7 == (Curl_header_store *)0x0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    pcVar3 = pCVar7->value;
    sVar4 = strlen(pcVar3);
    lVar8 = (long)pcVar3 - (long)pCVar7;
    if (pcVar10 != (char *)0x0) {
      do {
        cVar1 = header[(long)(pcVar10 + -1)];
        if (((cVar1 != '\t') && (cVar1 != ' ')) && (3 < (byte)(cVar1 - 10U))) goto LAB_0055950d;
        pcVar10 = pcVar10 + -1;
      } while (pcVar10 != (char *)0x0);
      pcVar10 = (char *)0x0;
    }
LAB_0055950d:
    local_40 = header;
    if (&DAT_00000001 < pcVar10) {
      pcVar3 = header + (long)(pcVar10 + -1);
      do {
        local_40 = header;
        if (((*header != ' ') && (*header != '\t')) || ((header[1] != ' ' && (header[1] != '\t'))))
        goto LAB_00559605;
        header = header + 1;
        pcVar10 = pcVar10 + -1;
      } while ((char *)0x1 < pcVar10);
      pcVar10 = (char *)0x1;
      local_40 = pcVar3;
    }
LAB_00559605:
    list = &(data->state).httphdrs;
    Curl_llist_remove(list,&pCVar7->node,(void *)0x0);
    pCVar7 = (Curl_header_store *)Curl_saferealloc(pCVar7,(size_t)(pcVar10 + sVar4 + lVar8 + 5));
    if (pCVar7 == (Curl_header_store *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pCVar7->name = pCVar7->buffer;
    pcVar3 = (char *)(lVar8 + (long)pCVar7);
    pCVar7->value = pcVar3;
    memcpy(pcVar3 + sVar4,local_40,(size_t)pcVar10);
    pCVar7->value[(long)(pcVar10 + sVar4)] = '\0';
    Curl_llist_insert_next(list,(data->state).httphdrs.tail,pCVar7,(Curl_llist_element *)pCVar7);
    (data->state).prevhead = pCVar7;
    return CURLE_OK;
  }
  pCVar7 = (Curl_header_store *)(*Curl_ccalloc)(1,(size_t)(pcVar3 + (0x31 - (long)header)));
  if (pCVar7 == (Curl_header_store *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  pcVar3 = pCVar7->buffer;
  memcpy(pcVar3,header,(size_t)pcVar10);
  pcVar10[(long)pCVar7->buffer] = '\0';
  pcVar5 = pcVar3;
  if (type == '\x10') {
    if (*pcVar3 != ':') {
      CVar9 = CURLE_BAD_FUNCTION_ARGUMENT;
      pcVar5 = (char *)0x0;
      bVar2 = false;
      goto LAB_005596fd;
    }
    pcVar5 = &pCVar7->field_0x2e;
  }
  do {
    pcVar6 = pcVar5;
    pcVar5 = pcVar6 + 1;
    if (*pcVar6 == '\0') {
      CVar9 = CURLE_BAD_FUNCTION_ARGUMENT;
      pcVar5 = (char *)0x0;
      bVar2 = false;
      goto LAB_005596fd;
    }
  } while (*pcVar6 != ':');
  *pcVar6 = '\0';
  for (; (*pcVar5 == ' ' || (*pcVar5 == '\t')); pcVar5 = pcVar5 + 1) {
  }
  bVar2 = true;
  for (pcVar10 = pcVar10 + (long)(pCVar7->buffer + -1);
      (CVar9 = CURLE_OK, pcVar5 < pcVar10 &&
      (((cVar1 = *pcVar10, cVar1 == '\t' || (cVar1 == ' ')) ||
       (CVar9 = CURLE_OK, (byte)(cVar1 - 10U) < 4)))); pcVar10 = pcVar10 + -1) {
    *pcVar10 = '\0';
  }
LAB_005596fd:
  if (!bVar2) {
    (*Curl_cfree)(pCVar7);
    return CVar9;
  }
  pCVar7->name = pcVar3;
  pCVar7->value = pcVar5;
  pCVar7->type = type;
  pCVar7->request = (data->state).requests;
  Curl_llist_insert_next
            (&(data->state).httphdrs,(data->state).httphdrs.tail,pCVar7,(Curl_llist_element *)pCVar7
            );
  (data->state).prevhead = pCVar7;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_headers_push(struct Curl_easy *data, const char *header,
                           unsigned char type)
{
  char *value = NULL;
  char *name = NULL;
  char *end;
  size_t hlen; /* length of the incoming header */
  struct Curl_header_store *hs;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  if((header[0] == '\r') || (header[0] == '\n'))
    /* ignore the body separator */
    return CURLE_OK;

  end = strchr(header, '\r');
  if(!end) {
    end = strchr(header, '\n');
    if(!end)
      return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  hlen = end - header + 1;

  if((header[0] == ' ') || (header[0] == '\t')) {
    if(data->state.prevhead)
      /* line folding, append value to the previous header's value */
      return unfold_value(data, header, hlen);
    else
      /* can't unfold without a previous header */
      return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  hs = calloc(1, sizeof(*hs) + hlen);
  if(!hs)
    return CURLE_OUT_OF_MEMORY;
  memcpy(hs->buffer, header, hlen);
  hs->buffer[hlen] = 0; /* nul terminate */

  result = namevalue(hs->buffer, hlen, type, &name, &value);
  if(result)
    goto fail;

  hs->name = name;
  hs->value = value;
  hs->type = type;
  hs->request = data->state.requests;

  /* insert this node into the list of headers */
  Curl_llist_insert_next(&data->state.httphdrs, data->state.httphdrs.tail,
                         hs, &hs->node);
  data->state.prevhead = hs;
  return CURLE_OK;
  fail:
  free(hs);
  return result;
}